

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O2

int i2d_PKCS7_ISSUER_AND_SUBJECT_bio(BIO *bio,PKCS7_ISSUER_AND_SUBJECT *ias)

{
  int len;
  int iVar1;
  uchar *pout;
  
  pout = (uchar *)0x0;
  iVar1 = 0;
  if (ias != (PKCS7_ISSUER_AND_SUBJECT *)0x0 && bio != (BIO *)0x0) {
    len = i2d_PKCS7_ISSUER_AND_SUBJECT(ias,&pout);
    iVar1 = 0;
    if (pout != (uchar *)0x0 && 0 < len) {
      BIO_write((BIO *)bio,pout,len);
      CRYPTO_free(pout);
      iVar1 = len;
    }
  }
  return iVar1;
}

Assistant:

int i2d_PKCS7_ISSUER_AND_SUBJECT_bio(BIO *bio, PKCS7_ISSUER_AND_SUBJECT *ias) {
	unsigned char * pout = NULL;
	int len = 0;

	if (!bio || !ias)
		return 0;

	len = i2d_PKCS7_ISSUER_AND_SUBJECT(ias, &pout);

	if (len <= 0 || !pout)
		return 0;

	BIO_write(bio, pout, len);
	OPENSSL_free(pout);

	return len;
}